

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_2_suite::run(void)

{
  test_ctor();
  test_same();
  test_one();
  test_two();
  test_three();
  test_linear_increase();
  test_clear();
  return;
}

Assistant:

void run()
{
    test_ctor();
    test_same();
    test_one();
    test_two();
    test_three();
    test_linear_increase();
    test_clear();
}